

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O3

void Mtr_PrintGroups(MtrNode *root,int silent)

{
  uint uVar1;
  MtrNode *root_00;
  
  if (root == (MtrNode *)0x0) {
    __assert_fail("root != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/mtr/mtrGroup.c"
                  ,0x21f,"void Mtr_PrintGroups(MtrNode *, int)");
  }
  if ((root->younger != (MtrNode *)0x0) && (root->younger->elder != root)) {
    __assert_fail("root->younger == NULL || root->younger->elder == root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/mtr/mtrGroup.c"
                  ,0x220,"void Mtr_PrintGroups(MtrNode *, int)");
  }
  if ((root->elder != (MtrNode *)0x0) && (root->elder->younger != root)) {
    __assert_fail("root->elder == NULL || root->elder->younger == root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/mtr/mtrGroup.c"
                  ,0x221,"void Mtr_PrintGroups(MtrNode *, int)");
  }
  if (silent == 0) {
    printf("(%u",(ulong)root->low);
  }
  if (((root->flags & 1) == 0) && (root_00 = root->child, root_00 != (MtrNode *)0x0)) {
    do {
      if ((root_00->low < root->low) ||
         ((int)(root->low + root->size) < (int)(root_00->low + root_00->size))) {
        __assert_fail("node->low >= root->low && (int) (node->low + node->size) <= (int) (root->low + root->size)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/mtr/mtrGroup.c"
                      ,0x22c,"void Mtr_PrintGroups(MtrNode *, int)");
      }
      if (root_00->parent != root) {
        __assert_fail("node->parent == root",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/mtr/mtrGroup.c"
                      ,0x22d,"void Mtr_PrintGroups(MtrNode *, int)");
      }
      Mtr_PrintGroups(root_00,silent);
      root_00 = root_00->younger;
    } while (root_00 != (MtrNode *)0x0);
    if (silent != 0) goto LAB_0081c32a;
  }
  else {
    if (silent != 0) goto LAB_0081c32a;
    putchar(0x2c);
  }
  printf("%u",(ulong)((root->low + root->size) - 1));
  if (root->flags != 0) {
    putchar(0x7c);
    uVar1 = root->flags;
    if ((uVar1 & 4) != 0) {
      putchar(0x46);
      uVar1 = root->flags;
    }
    if ((uVar1 & 8) != 0) {
      putchar(0x4e);
      uVar1 = root->flags;
    }
    if ((uVar1 & 2) != 0) {
      putchar(0x53);
    }
  }
  putchar(0x29);
  if (root->parent == (MtrNode *)0x0) {
    putchar(10);
  }
LAB_0081c32a:
  if (0xf < root->flags) {
    __assert_fail("(root->flags &~(MTR_TERMINAL | MTR_SOFT | MTR_FIXED | MTR_NEWNODE)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/mtr/mtrGroup.c"
                  ,0x241,"void Mtr_PrintGroups(MtrNode *, int)");
  }
  return;
}

Assistant:

void
Mtr_PrintGroups(
  MtrNode * root /* root of the group tree */,
  int  silent /* flag to check tree syntax only */)
{
    MtrNode *node;

    assert(root != NULL);
    assert(root->younger == NULL || root->younger->elder == root);
    assert(root->elder == NULL || root->elder->younger == root);
#if SIZEOF_VOID_P == 8
    if (!silent) (void) printf("(%u",root->low);
#else
    if (!silent) (void) printf("(%hu",root->low);
#endif
    if (MTR_TEST(root,MTR_TERMINAL) || root->child == NULL) {
        if (!silent) (void) printf(",");
    } else {
        node = root->child;
        while (node != NULL) {
            assert(node->low >= root->low && (int) (node->low + node->size) <= (int) (root->low + root->size));
            assert(node->parent == root);
            Mtr_PrintGroups(node,silent);
            node = node->younger;
        }
    }
    if (!silent) {
#if SIZEOF_VOID_P == 8
        (void) printf("%u", root->low + root->size - 1);
#else
        (void) printf("%hu", root->low + root->size - 1);
#endif
        if (root->flags != MTR_DEFAULT) {
            (void) printf("|");
            if (MTR_TEST(root,MTR_FIXED)) (void) printf("F");
            if (MTR_TEST(root,MTR_NEWNODE)) (void) printf("N");
            if (MTR_TEST(root,MTR_SOFT)) (void) printf("S");
        }
        (void) printf(")");
        if (root->parent == NULL) (void) printf("\n");
    }
    assert((root->flags &~(MTR_TERMINAL | MTR_SOFT | MTR_FIXED | MTR_NEWNODE)) == 0);
    return;

}